

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGaussIntegrationRule.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChGaussIntegrationRule::SetIntOnCube
          (ChGaussIntegrationRule *this,int nPoints,
          vector<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
          *GpVector)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ChGaussPoint *pCVar5;
  long lVar6;
  ChLog *this_00;
  ChStreamOutAscii *this_01;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  long lVar15;
  bool bVar16;
  ChVector<double> coord;
  vector<double,_std::allocator<double>_> w;
  vector<double,_std::allocator<double>_> c;
  ChVector<double> local_a8;
  vector<double,_std::allocator<double>_> local_88;
  vector<double,_std::allocator<double>_> local_68;
  vector<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_> *local_48;
  long local_40;
  uint local_34;
  
  local_a8.m_data[2] = 0.0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.m_data[0] = 0.0;
  local_a8.m_data[1] = 0.0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48 = GpVector;
  std::vector<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>::resize
            (GpVector,(long)nPoints);
  if (nPoints < 0x1b) {
    if (nPoints == 1) {
      local_a8.m_data[2] = 0.0;
      local_a8.m_data[0] = 0.0;
      local_a8.m_data[1] = 0.0;
      pCVar5 = (ChGaussPoint *)::operator_new(0xa0);
      ChGaussPoint::ChGaussPoint(pCVar5,1,&local_a8,8.0);
      *(local_48->
       super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
       )._M_impl.super__Vector_impl_data._M_start = pCVar5;
      goto LAB_00604ad1;
    }
    if (nPoints == 8) {
      std::vector<double,_std::allocator<double>_>::resize(&local_68,2);
      std::vector<double,_std::allocator<double>_>::resize(&local_88,2);
      lVar12 = 0;
      *local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = -0.577350269189626;
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = 0.577350269189626;
      *local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = 1.0;
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = 1.0;
      lVar6 = CONCAT71((int7)((ulong)local_88.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 8),1);
      do {
        local_34 = (uint)lVar6;
        local_40 = lVar12 * 4;
        lVar13 = 0;
        lVar6 = 1;
        do {
          uVar7 = 0;
          uVar1 = local_40 + lVar13 * 2;
          bVar16 = true;
          do {
            bVar14 = bVar16;
            local_a8.m_data[0] =
                 local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12];
            local_a8.m_data[1] =
                 local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar13];
            local_a8.m_data[2] =
                 local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7];
            dVar2 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar12];
            dVar3 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13];
            dVar4 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar7];
            pCVar5 = (ChGaussPoint *)::operator_new(0xa0);
            uVar7 = uVar7 | uVar1;
            ChGaussPoint::ChGaussPoint(pCVar5,(int)uVar7 + 1,&local_a8,dVar3 * dVar2 * dVar4);
            (local_48->
            super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
            )._M_impl.super__Vector_impl_data._M_start[uVar7] = pCVar5;
            uVar7 = 1;
            bVar16 = false;
          } while (bVar14);
          bVar16 = lVar6 != 0;
          lVar13 = 1;
          lVar6 = 0;
        } while (bVar16);
        lVar12 = 1;
      } while ((local_34 & 1) != 0);
      goto LAB_00604ad1;
    }
  }
  else {
    if (nPoints == 0x1b) {
      std::vector<double,_std::allocator<double>_>::resize(&local_68,3);
      std::vector<double,_std::allocator<double>_>::resize(&local_88,3);
      lVar6 = 0;
      lVar12 = 0;
      *local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = -0.774596669241483;
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = 0.0;
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[2] = 0.774596669241483;
      *local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = 0.555555555555555;
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = 0.888888888888888;
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[2] = 0.555555555555555;
      do {
        lVar8 = 0;
        lVar13 = lVar6;
        do {
          lVar15 = 0;
          lVar9 = lVar13;
          do {
            local_a8.m_data[0] =
                 local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12];
            local_a8.m_data[1] =
                 local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8];
            local_a8.m_data[2] =
                 local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar15];
            dVar2 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar12];
            dVar3 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar8];
            dVar4 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar15];
            pCVar5 = (ChGaussPoint *)::operator_new(0xa0);
            ChGaussPoint::ChGaussPoint(pCVar5,(int)lVar9 + 1,&local_a8,dVar3 * dVar2 * dVar4);
            lVar15 = lVar15 + 1;
            (local_48->
            super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
            )._M_impl.super__Vector_impl_data._M_start[lVar9] = pCVar5;
            lVar9 = lVar9 + 1;
          } while (lVar15 != 3);
          lVar8 = lVar8 + 1;
          lVar13 = lVar13 + 3;
        } while (lVar8 != 3);
        lVar12 = lVar12 + 1;
        lVar6 = lVar6 + 9;
      } while (lVar12 != 3);
      goto LAB_00604ad1;
    }
    if (nPoints == 0x40) {
      std::vector<double,_std::allocator<double>_>::resize(&local_68,4);
      std::vector<double,_std::allocator<double>_>::resize(&local_88,4);
      iVar10 = 1;
      lVar12 = 0;
      lVar6 = 0;
      *local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = -0.861136311594053;
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = -0.339981043584856;
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[2] = 0.339981043584856;
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[3] = 0.861136311594053;
      *local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = 0.347854845137454;
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = 0.652145154862546;
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[2] = 0.652145154862546;
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[3] = 0.347854845137454;
      do {
        lVar13 = 0;
        local_40 = lVar12;
        iVar11 = iVar10;
        do {
          lVar8 = 0;
          do {
            local_a8.m_data[0] =
                 local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6];
            local_a8.m_data[1] =
                 local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar13];
            local_a8.m_data[2] =
                 local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8];
            dVar2 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar6];
            dVar3 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13];
            dVar4 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar8];
            pCVar5 = (ChGaussPoint *)::operator_new(0xa0);
            ChGaussPoint::ChGaussPoint(pCVar5,iVar11 + (int)lVar8,&local_a8,dVar3 * dVar2 * dVar4);
            *(ChGaussPoint **)
             ((long)(local_48->
                    super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
                    )._M_impl.super__Vector_impl_data._M_start + lVar8 * 8 + lVar12) = pCVar5;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          lVar13 = lVar13 + 1;
          iVar11 = iVar11 + 4;
          lVar12 = lVar12 + 0x20;
        } while (lVar13 != 4);
        lVar6 = lVar6 + 1;
        iVar10 = iVar10 + 0x10;
        lVar12 = local_40 + 0x80;
      } while (lVar6 != 4);
      goto LAB_00604ad1;
    }
  }
  this_00 = GetLog();
  this_01 = ChStreamOutAscii::operator<<
                      (&this_00->super_ChStreamOutAscii,
                       "SetIntOnCube: unsupported number of integration points: ");
  ChStreamOutAscii::operator<<(this_01,nPoints);
LAB_00604ad1:
  if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ChGaussIntegrationRule::SetIntOnCube(int nPoints, std::vector<ChGaussPoint*>* GpVector) {
    int i, j, k;
    double weight;
    ChVector<> coord;
    std::vector<double> c, w;

    // Resize the vector containing Gauss Points
    // GpVector = new std::vector<ChGaussPoint> [ nPoints ];
    (*GpVector).resize(nPoints);

    switch (nPoints) {
        case 1:

            coord.x() = 0.0;
            coord.y() = 0.0;
            coord.z() = 0.0;
            weight = 8.0;
            (*GpVector)[0] = new ChGaussPoint(1, &coord, weight);
            break;

        case 8:

            c.resize(2);
            w.resize(2);
            c[0] = -0.577350269189626;
            c[1] = 0.577350269189626;

            w[0] = 1.0;
            w[1] = 1.0;

            for (i = 0; i < 2; i++) {
                for (j = 0; j < 2; j++) {
                    for (k = 0; k < 2; k++) {
                        coord.x() = c[i];
                        coord.y() = c[j];
                        coord.z() = c[k];
                        weight = w[i] * w[j] * w[k];
                        // ChGaussPoint* my_gp = new ChGaussPoint( 4 *i + 2 *j + k , &coord, weight);
                        (*GpVector)[4 * i + 2 * j + k] = new ChGaussPoint(4 * i + 2 * j + k + 1, &coord, weight);
                    }
                }
            }

            break;

        case 27:

            c.resize(3);
            w.resize(3);
            c[0] = -0.774596669241483;
            c[1] = 0.0;
            c[2] = 0.774596669241483;

            w[0] = 0.555555555555555;
            w[1] = 0.888888888888888;
            w[2] = 0.555555555555555;

            for (i = 0; i < 3; i++) {
                for (j = 0; j < 3; j++) {
                    for (k = 0; k < 3; k++) {
                        coord.x() = c[i];
                        coord.y() = c[j];
                        coord.z() = c[k];
                        weight = w[i] * w[j] * w[k];
                        (*GpVector)[9 * i + 3 * j + k] = new ChGaussPoint(9 * i + 3 * j + k + 1, &coord, weight);
                    }
                }
            }

            break;

        case 64:

            c.resize(4);
            w.resize(4);
            c[0] = -0.861136311594053;
            c[1] = -0.339981043584856;
            c[2] = 0.339981043584856;
            c[3] = 0.861136311594053;

            w[0] = 0.347854845137454;
            w[1] = 0.652145154862546;
            w[2] = 0.652145154862546;
            w[3] = 0.347854845137454;

            for (i = 0; i < 4; i++) {
                for (j = 0; j < 4; j++) {
                    for (k = 0; k < 4; k++) {
                        coord.x() = c[i];
                        coord.y() = c[j];
                        coord.z() = c[k];
                        weight = w[i] * w[j] * w[k];
                        (*GpVector)[16 * i + 4 * j + k] = new ChGaussPoint(16 * i + 4 * j + k + 1, &coord, weight);
                    }
                }
            }

            break;

        default:
            GetLog() << "SetIntOnCube: unsupported number of integration points: " << nPoints;

    }  //__end of Switch
}